

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O2

void google::protobuf::compiler::rust::GenerateOneofAccessors
               (Context *ctx,OneofDescriptor *oneof,AccessorCase accessor_case)

{
  basic_string_view<char,_std::char_traits<char>_> *value;
  OneofDescriptor *oneof_00;
  OneofDescriptor *oneof_01;
  long lVar1;
  string_view in_stack_fffffffffffff7b8;
  undefined1 *local_838;
  undefined8 local_830;
  undefined1 local_828 [8];
  undefined8 uStack_820;
  undefined1 *local_818;
  undefined8 local_810;
  undefined1 local_808 [8];
  undefined8 uStack_800;
  _Any_data local_7f8;
  code *local_7e8;
  code *pcStack_7e0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  undefined1 local_730 [64];
  string local_6f0;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string local_690;
  AlphaNum local_670;
  string_view local_640;
  string_view local_630;
  size_type local_620;
  pointer local_618;
  Sub local_5f0 [4];
  Sub local_310;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"oneof_name",(allocator<char> *)&stack0xfffffffffffff7c7);
  RsSafeName_abi_cxx11_(in_stack_fffffffffffff7b8);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_5f0,&local_690,&local_6b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"view_lifetime",(allocator<char> *)&stack0xfffffffffffff7c6);
  local_630 = ViewLifetime(accessor_case);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (local_5f0 + 1,&local_6d0,&local_630);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"self",(allocator<char> *)&stack0xfffffffffffff7c5);
  local_640 = ViewReceiver(accessor_case);
  value = &local_640;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (local_5f0 + 2,&local_6f0,value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_730 + 0x20),"oneof_enum_module",
             (allocator<char> *)&stack0xfffffffffffff7c4);
  local_670.piece_ = absl::lts_20240722::NullSafeStringView("crate::");
  RustModuleForContainingType_abi_cxx11_
            (&local_7d0,(rust *)ctx,*(Context **)(oneof + 0x10),(Descriptor *)value);
  local_620 = local_7d0._M_string_length;
  local_618 = local_7d0._M_dataplus._M_p;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_730,&local_670);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (local_5f0 + 3,(string *)(local_730 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,"view_enum_name",(allocator<char> *)&stack0xfffffffffffff7c3);
  OneofViewEnumRsName_abi_cxx11_(&local_770,(rust *)oneof,oneof_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_750,&local_770);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"case_enum_name",(allocator<char> *)&stack0xfffffffffffff7c2);
  OneofCaseEnumRsName_abi_cxx11_(&local_7b0,(rust *)oneof,oneof_01);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_790,&local_7b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"view_cases",(allocator<char> *)&stack0xfffffffffffff7c1);
  local_1a0 = local_190;
  if (local_818 == local_808) {
    uStack_188 = uStack_800;
  }
  else {
    local_1a0 = local_818;
  }
  local_198 = local_810;
  local_810 = 0;
  local_808[0] = 0;
  local_7e8 = (code *)0x0;
  pcStack_7e0 = (code *)0x0;
  local_7f8._M_unused._M_object = (void *)0x0;
  local_7f8._8_8_ = 0;
  local_818 = local_808;
  local_7f8._M_unused._M_object = operator_new(0x18);
  *(OneofDescriptor **)local_7f8._M_unused._0_8_ = oneof;
  *(Context **)((long)local_7f8._M_unused._0_8_ + 8) = ctx;
  *(code *)((long)local_7f8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_7e0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_7e8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_7f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_7f8);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"oneof_case_body",(allocator<char> *)&stack0xfffffffffffff7c0);
  local_e8 = local_d8;
  if (local_838 == local_828) {
    uStack_d0 = uStack_820;
  }
  else {
    local_e8 = local_838;
  }
  local_e0 = local_830;
  local_830 = 0;
  local_828[0] = 0;
  local_7e8 = (code *)0x0;
  pcStack_7e0 = (code *)0x0;
  local_7f8._M_unused._M_object = (void *)0x0;
  local_7f8._8_8_ = 0;
  local_838 = local_828;
  local_7f8._M_unused._M_object = operator_new(0x18);
  *(Context **)local_7f8._M_unused._0_8_ = ctx;
  *(OneofDescriptor **)((long)local_7f8._M_unused._0_8_ + 8) = oneof;
  *(code *)((long)local_7f8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_7e0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_7e8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_7f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_7f8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  Context::Emit(ctx,local_5f0,8,0x192,
                "\n        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {\n          match $self$.$oneof_name$_case() {\n            $view_cases$\n            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)\n          }\n        }\n\n        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {\n          $oneof_case_body$\n        }\n      "
               );
  lVar1 = 0x508;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_5f0[0].key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)local_730);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)(local_730 + 0x20));
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  return;
}

Assistant:

void GenerateOneofAccessors(Context& ctx, const OneofDescriptor& oneof,
                            AccessorCase accessor_case) {
  ctx.Emit(
      {{"oneof_name", RsSafeName(oneof.name())},
       {"view_lifetime", ViewLifetime(accessor_case)},
       {"self", ViewReceiver(accessor_case)},
       {"oneof_enum_module",
        absl::StrCat("crate::", RustModuleForContainingType(
                                    ctx, oneof.containing_type()))},
       {"view_enum_name", OneofViewEnumRsName(oneof)},
       {"case_enum_name", OneofCaseEnumRsName(oneof)},
       {"view_cases",
        [&] {
          for (int i = 0; i < oneof.field_count(); ++i) {
            auto& field = *oneof.field(i);
            std::string rs_type = RsTypeNameView(ctx, field);
            if (rs_type.empty()) {
              continue;
            }
            std::string field_name = FieldNameWithCollisionAvoidance(field);
            ctx.Emit(
                {
                    {"case", OneofCaseRsName(field)},
                    {"rs_getter", RsSafeName(field_name)},
                    {"type", rs_type},
                },
                R"rs(
                $oneof_enum_module$$case_enum_name$::$case$ =>
                    $oneof_enum_module$$view_enum_name$::$case$(self.$rs_getter$()),
                )rs");
          }
        }},
       {"oneof_case_body",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"case_thunk", ThunkName(ctx, oneof, "case")}},
                     "unsafe { $case_thunk$(self.raw_msg()) }");
          } else {
            ctx.Emit(
                // The field index for an arbitrary field that in the oneof.
                {{"upb_mt_field_index",
                  UpbMiniTableFieldIndex(*oneof.field(0))}},
                R"rs(
                let field_num = unsafe {
                  let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                      <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                      $upb_mt_field_index$);
                  $pbr$::upb_Message_WhichOneofFieldNumber(
                        self.raw_msg(), f)
                };
                unsafe {
                  $oneof_enum_module$$case_enum_name$::try_from(field_num).unwrap_unchecked()
                }
              )rs");
          }
        }}},
      R"rs(
        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {
          match $self$.$oneof_name$_case() {
            $view_cases$
            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)
          }
        }

        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {
          $oneof_case_body$
        }
      )rs");
}